

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O1

pair<wasm::Name,_wasm::Name> * __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::pop
          (pair<wasm::Name,_wasm::Name> *__return_storage_ptr__,
          UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this)

{
  _Map_pointer pppVar1;
  _Elt_pointer ppVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  
  do {
    pppVar1 = (this->data).c.
              super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar2 = (this->data).c.
             super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->data).c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar2 >> 5) +
        ((long)(this->data).c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->data).c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
        ((((ulong)((long)pppVar1 -
                  (long)(this->data).c.
                        super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppVar1 == (_Map_pointer)0x0)) * 0x10 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::Name, wasm::Name>>::pop() [T = std::pair<wasm::Name, wasm::Name>]"
                   );
    }
    sVar3 = (ppVar2->first).super_IString.str._M_len;
    pcVar4 = (ppVar2->first).super_IString.str._M_str;
    pcVar5 = (ppVar2->second).super_IString.str._M_str;
    (__return_storage_ptr__->second).super_IString.str._M_len =
         (ppVar2->second).super_IString.str._M_len;
    (__return_storage_ptr__->second).super_IString.str._M_str = pcVar5;
    (__return_storage_ptr__->first).super_IString.str._M_len = sVar3;
    (__return_storage_ptr__->first).super_IString.str._M_str = pcVar4;
    pmVar6 = std::__detail::
             _Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,__return_storage_ptr__);
    *pmVar6 = *pmVar6 - 1;
    std::
    deque<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>::
    pop_front((deque<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               *)this);
    pmVar6 = std::__detail::
             _Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,__return_storage_ptr__);
  } while (*pmVar6 != 0);
  return __return_storage_ptr__;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }